

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnumValue
          (DescriptorBuilder *this,EnumValueDescriptorProto *proto,EnumDescriptor *parent,
          EnumValueDescriptor *result)

{
  Tables *this_00;
  FileDescriptorTables *this_01;
  Symbol symbol;
  EnumValueDescriptor *parent_00;
  EnumDescriptor *pEVar1;
  bool bVar2;
  int32 iVar3;
  string *psVar4;
  EnumValueOptions *orig_options;
  Descriptor *pDVar5;
  string *psVar6;
  ulong uVar7;
  Symbol symbol_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  undefined1 local_80 [8];
  string outer_scope;
  anon_union_8_7_bfa3a334_for_Symbol_2 local_58;
  undefined1 auStack_48 [7];
  bool added_to_inner_scope;
  anon_union_8_7_bfa3a334_for_Symbol_2 local_40;
  byte local_31;
  string *psStack_30;
  bool added_to_outer_scope;
  string *full_name;
  EnumValueDescriptor *result_local;
  EnumDescriptor *parent_local;
  EnumValueDescriptorProto *proto_local;
  DescriptorBuilder *this_local;
  
  this_00 = this->tables_;
  full_name = (string *)result;
  result_local = (EnumValueDescriptor *)parent;
  parent_local = (EnumDescriptor *)proto;
  proto_local = (EnumValueDescriptorProto *)this;
  psVar4 = EnumValueDescriptorProto::name_abi_cxx11_(proto);
  psVar4 = DescriptorPool::Tables::AllocateString(this_00,psVar4);
  *(string **)full_name = psVar4;
  iVar3 = EnumValueDescriptorProto::number((EnumValueDescriptorProto *)parent_local);
  *(int32 *)&full_name->field_2 = iVar3;
  *(EnumValueDescriptor **)((long)&full_name->field_2 + 8) = result_local;
  psVar4 = DescriptorPool::Tables::AllocateString(this->tables_,*(string **)(result_local + 8));
  psStack_30 = psVar4;
  std::__cxx11::string::size();
  std::__cxx11::string::size();
  std::__cxx11::string::resize((ulong)psVar4);
  std::__cxx11::string::append((string *)psStack_30);
  full_name->_M_string_length = (size_type)psStack_30;
  psVar4 = EnumValueDescriptorProto::name_abi_cxx11_((EnumValueDescriptorProto *)parent_local);
  ValidateSymbolName(this,psVar4,psStack_30,(Message *)parent_local);
  bVar2 = EnumValueDescriptorProto::has_options((EnumValueDescriptorProto *)parent_local);
  if (bVar2) {
    orig_options = EnumValueDescriptorProto::options((EnumValueDescriptorProto *)parent_local);
    AllocateOptions<google::protobuf::EnumValueDescriptor>
              (this,orig_options,(EnumValueDescriptor *)full_name);
  }
  else {
    *(undefined8 *)(full_name + 1) = 0;
  }
  psVar4 = EnumValueDescriptor::full_name_abi_cxx11_((EnumValueDescriptor *)full_name);
  pDVar5 = EnumDescriptor::containing_type((EnumDescriptor *)result_local);
  psVar6 = EnumValueDescriptor::name_abi_cxx11_((EnumValueDescriptor *)full_name);
  pEVar1 = parent_local;
  anon_unknown_1::Symbol::Symbol((Symbol *)auStack_48,(EnumValueDescriptor *)full_name);
  symbol.field_1.descriptor = local_40.descriptor;
  symbol.type = auStack_48._0_4_;
  symbol._4_4_ = stack0xffffffffffffffbc;
  local_31 = AddSymbol(this,psVar4,pDVar5,psVar6,(Message *)pEVar1,symbol);
  parent_00 = result_local;
  this_01 = this->file_tables_;
  psVar4 = EnumValueDescriptor::name_abi_cxx11_((EnumValueDescriptor *)full_name);
  anon_unknown_1::Symbol::Symbol
            ((Symbol *)((long)&outer_scope.field_2 + 8),(EnumValueDescriptor *)full_name);
  symbol_00._4_4_ = 0;
  symbol_00.type = outer_scope.field_2._8_4_;
  symbol_00.field_1.descriptor = local_58.descriptor;
  bVar2 = FileDescriptorTables::AddAliasUnderParent(this_01,parent_00,psVar4,symbol_00);
  if ((bVar2) && ((local_31 & 1) == 0)) {
    std::__cxx11::string::string((string *)local_80);
    pDVar5 = EnumDescriptor::containing_type((EnumDescriptor *)result_local);
    if (pDVar5 == (Descriptor *)0x0) {
      psVar4 = FileDescriptor::package_abi_cxx11_(this->file_);
      std::__cxx11::string::operator=((string *)local_80,(string *)psVar4);
    }
    else {
      pDVar5 = EnumDescriptor::containing_type((EnumDescriptor *)result_local);
      psVar4 = Descriptor::full_name_abi_cxx11_(pDVar5);
      std::__cxx11::string::operator=((string *)local_80,(string *)psVar4);
    }
    uVar7 = std::__cxx11::string::empty();
    if ((uVar7 & 1) == 0) {
      std::operator+(&local_d0,"\"",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
      std::operator+(&local_b0,&local_d0,"\"");
      std::__cxx11::string::operator=((string *)local_80,(string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
    }
    else {
      std::__cxx11::string::operator=((string *)local_80,"the global scope");
    }
    psVar4 = EnumValueDescriptor::full_name_abi_cxx11_((EnumValueDescriptor *)full_name);
    pEVar1 = parent_local;
    psVar6 = EnumValueDescriptor::name_abi_cxx11_((EnumValueDescriptor *)full_name);
    std::operator+(&local_190,
                   "Note that enum values use C++ scoping rules, meaning that enum values are siblings of their type, not children of it.  Therefore, \""
                   ,psVar6);
    std::operator+(&local_170,&local_190,"\" must be unique within ");
    std::operator+(&local_150,&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80);
    std::operator+(&local_130,&local_150,", not just within \"");
    psVar6 = EnumDescriptor::name_abi_cxx11_((EnumDescriptor *)result_local);
    std::operator+(&local_110,&local_130,psVar6);
    std::operator+(&local_f0,&local_110,"\".");
    AddError(this,psVar4,(Message *)pEVar1,NAME,&local_f0);
    std::__cxx11::string::~string((string *)&local_f0);
    std::__cxx11::string::~string((string *)&local_110);
    std::__cxx11::string::~string((string *)&local_130);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)local_80);
  }
  FileDescriptorTables::AddEnumValueByNumber(this->file_tables_,(EnumValueDescriptor *)full_name);
  return;
}

Assistant:

void DescriptorBuilder::BuildEnumValue(const EnumValueDescriptorProto& proto,
                                       const EnumDescriptor* parent,
                                       EnumValueDescriptor* result) {
  result->name_   = tables_->AllocateString(proto.name());
  result->number_ = proto.number();
  result->type_   = parent;

  // Note:  full_name for enum values is a sibling to the parent's name, not a
  //   child of it.
  string* full_name = tables_->AllocateString(*parent->full_name_);
  full_name->resize(full_name->size() - parent->name_->size());
  full_name->append(*result->name_);
  result->full_name_ = full_name;

  ValidateSymbolName(proto.name(), *full_name, proto);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  // Again, enum values are weird because we makes them appear as siblings
  // of the enum type instead of children of it.  So, we use
  // parent->containing_type() as the value's parent.
  bool added_to_outer_scope =
    AddSymbol(result->full_name(), parent->containing_type(), result->name(),
              proto, Symbol(result));

  // However, we also want to be able to search for values within a single
  // enum type, so we add it as a child of the enum type itself, too.
  // Note:  This could fail, but if it does, the error has already been
  //   reported by the above AddSymbol() call, so we ignore the return code.
  bool added_to_inner_scope =
    file_tables_->AddAliasUnderParent(parent, result->name(), Symbol(result));

  if (added_to_inner_scope && !added_to_outer_scope) {
    // This value did not conflict with any values defined in the same enum,
    // but it did conflict with some other symbol defined in the enum type's
    // scope.  Let's print an additional error to explain this.
    string outer_scope;
    if (parent->containing_type() == NULL) {
      outer_scope = file_->package();
    } else {
      outer_scope = parent->containing_type()->full_name();
    }

    if (outer_scope.empty()) {
      outer_scope = "the global scope";
    } else {
      outer_scope = "\"" + outer_scope + "\"";
    }

    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::NAME,
             "Note that enum values use C++ scoping rules, meaning that "
             "enum values are siblings of their type, not children of it.  "
             "Therefore, \"" + result->name() + "\" must be unique within "
             + outer_scope + ", not just within \"" + parent->name() + "\".");
  }

  // An enum is allowed to define two numbers that refer to the same value.
  // FindValueByNumber() should return the first such value, so we simply
  // ignore AddEnumValueByNumber()'s return code.
  file_tables_->AddEnumValueByNumber(result);
}